

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O3

void __thiscall qpdf::pl::Count::~Count(Count *this)

{
  ~Count(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~Count() final = default;